

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  GLFWwindow *handle;
  char *pcVar3;
  long lVar4;
  char *args [3];
  
  bVar1 = true;
  lVar4 = 1;
  do {
    if (argc <= lVar4) {
      pcVar3 = "child";
      if (bVar1) {
        pcVar3 = "parent";
      }
      fprintf(_stdout,"%s\n",pcVar3);
      fflush(_stdout);
      if (bVar1) {
        args[0] = *argv;
        args[1] = "-child";
        args[2] = (char *)0x0;
        iVar2 = execute(args);
      }
      else {
        glfwInit();
        iVar2 = 0;
        glfwWindowHint(0x20004,0);
        handle = glfwCreateWindow(0xfa,0xfa,*argv,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
        if (handle == (GLFWwindow *)0x0) {
          iVar2 = 0x7d;
        }
        else {
          glfwMakeContextCurrent(handle);
          glFlush();
          glfwDestroyWindow(handle);
          glfwTerminate();
        }
      }
      return iVar2;
    }
    pcVar3 = argv[lVar4];
    iVar2 = strcmp(pcVar3,"-child");
    lVar4 = lVar4 + 1;
    bVar1 = false;
  } while (iVar2 == 0);
  fprintf(_stderr,"error: unknown arg %s\n",pcVar3);
  exit(1);
}

Assistant:

int
main(int argc, char **argv)
{
    GLboolean child = GL_FALSE;
    int i;

    for (i = 1; i < argc; ++i) {
        const char *arg = argv[i];
        if (strcmp(arg, "-child") == 0) {
            child = GL_TRUE;
        } else {
            fprintf(stderr, "error: unknown arg %s\n", arg);
            exit(1);
        }
    }

    fprintf(stdout, "%s\n", child ? "child" : "parent");
    fflush(stdout);

    if (child) {
        GLFWwindow* window = NULL;

        glfwInit();

        glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

        window = glfwCreateWindow(250, 250, argv[0], NULL, NULL);
        if (!window) {
             return EXIT_SKIP;
        }

        glfwMakeContextCurrent(window);

        glFlush();

        glfwDestroyWindow(window);
        glfwTerminate();

        return 0;
    } else {
        const char *args[3];

        args[0] = argv[0];
        args[1] = "-child";
        args[2] = NULL;
        return execute((char * const *)args);
    }
}